

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O3

void * operator_new__(size_t size,align_val_t val)

{
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *self;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  c;
  Alloc<void> AVar1;
  ulong uVar2;
  undefined8 *in_FS_OFFSET;
  undefined8 uStack_8;
  
  uVar2 = size - 1 | val - 1;
  self = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  if (uVar2 == 0xffffffffffffffff) {
    AVar1 = snmalloc::
            Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
            alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>
                      (-(ulong)(size != 0),self);
    return AVar1.unsafe_capptr;
  }
  if (uVar2 < 0xe000) {
    fl = (self->super_FastFreeLists).small_fast_free_lists +
         (byte)(&snmalloc::sizeclass_lookup)[uVar2 >> 4];
    AVar1.unsafe_capptr = (fl->curr).unsafe_capptr;
    if ((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)AVar1.unsafe_capptr ==
        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)0x0) {
      uStack_8 = size;
      if ((self->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
          (self->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        AVar1 = snmalloc::
                Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
                small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&uStack_8 + 7),self,
                           (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar2 >> 4],fl);
      }
      else {
        AVar1 = snmalloc::
                Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
                handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                          ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                            *)self);
      }
    }
    else {
      (fl->curr).unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)AVar1.unsafe_capptr)->field_0;
    }
    return AVar1.unsafe_capptr;
  }
  AVar1 = snmalloc::
          Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
          alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(uVar2 + 1,self);
  return AVar1.unsafe_capptr;
}

Assistant:

void* operator new[](size_t size, std::align_val_t val)
{
  size = snmalloc::aligned_size(size_t(val), size);
  return snmalloc::libc::malloc(size);
}